

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O0

void Gia_ManTerStatePrint(uint *pState,int nRegs,int iNum)

{
  int iVar1;
  uint local_28;
  uint local_24;
  int nDcs;
  int nOnes;
  int nZeros;
  int i;
  int iNum_local;
  int nRegs_local;
  uint *pState_local;
  
  nDcs = 0;
  local_24 = 0;
  local_28 = 0;
  printf(" %4d : ",(ulong)(uint)iNum);
  nOnes = 0;
  do {
    if (nRegs <= nOnes) {
      printf(" (0=%4d, 1=%4d, x=%4d)\n",(ulong)(uint)nDcs,(ulong)local_24,(ulong)local_28);
      return;
    }
    iVar1 = Gia_ManTerSimInfoGet(pState,nOnes);
    if (iVar1 == 1) {
      printf("0");
      nDcs = nDcs + 1;
    }
    else {
      iVar1 = Gia_ManTerSimInfoGet(pState,nOnes);
      if (iVar1 == 2) {
        printf("1");
        local_24 = local_24 + 1;
      }
      else {
        iVar1 = Gia_ManTerSimInfoGet(pState,nOnes);
        if (iVar1 != 3) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTsim.c"
                        ,0x1e9,"void Gia_ManTerStatePrint(unsigned int *, int, int)");
        }
        printf("x");
        local_28 = local_28 + 1;
      }
    }
    nOnes = nOnes + 1;
  } while( true );
}

Assistant:

void Gia_ManTerStatePrint( unsigned * pState, int nRegs, int iNum )
{
    int i, nZeros = 0, nOnes = 0, nDcs = 0;
    printf( " %4d : ", iNum );
    for ( i = 0; i < nRegs; i++ )
    {
        if ( Gia_ManTerSimInfoGet(pState, i) == GIA_ZER )
            printf( "0" ), nZeros++;
        else if ( Gia_ManTerSimInfoGet(pState, i) == GIA_ONE )
            printf( "1" ), nOnes++;
        else if ( Gia_ManTerSimInfoGet(pState, i) == GIA_UND )
            printf( "x" ), nDcs++;
        else
            assert( 0 );
    }
    printf( " (0=%4d, 1=%4d, x=%4d)\n", nZeros, nOnes, nDcs );
}